

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::codec_traits<boost::array<unsigned_char,_16UL>_>::decode
               (Decoder *d,array<unsigned_char,_16UL> *s)

{
  reference __last;
  reference pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  array<unsigned_char,_16UL> *in_RSI;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  uchar *__result;
  allocator_type *in_stack_ffffffffffffffb0;
  undefined1 *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  array<unsigned_char,_16UL> *local_10;
  long *local_8;
  
  __n = &local_29;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2c566d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2c568d);
  (**(code **)(*local_8 + 0x68))(local_8,0x10,&local_28);
  __result = (uchar *)0x0;
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_28,(size_type)__result);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pvVar1 + 0x10);
  boost::array<unsigned_char,_16UL>::operator[](local_10,(size_type)__result);
  std::copy<unsigned_char*,unsigned_char*>((uchar *)this,__last,__result);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

static void decode(Decoder& d, boost::array<uint8_t, N>& s) {
        std::vector<uint8_t> v(N);
        d.decodeFixed(N, v);
        std::copy(&v[0], &v[0] + N, &s[0]);
    }